

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,wabt::interp::Simd<unsigned_int,(unsigned_char)2>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  uint uVar1;
  Simd<unsigned_long,_(unsigned_char)__x02_> value;
  Instr instr_00;
  RunResult RVar2;
  uint *puVar3;
  unsigned_long *puVar4;
  byte local_51;
  undefined1 auStack_50 [7];
  u8 i;
  Simd<unsigned_long,_(unsigned_char)__x02_> result;
  Simd<unsigned_int,_(unsigned_char)__x02_> local_28;
  Simd<unsigned_int,_(unsigned_char)__x02_> val;
  Ptr *out_trap_local;
  Thread *this_local;
  
  instr_00 = instr;
  result.v[1]._0_4_ = instr.op.enum_;
  result.v[1]._4_4_ = instr.kind;
  val.v = (uint  [2])out_trap;
  RVar2 = Load<wabt::interp::Simd<unsigned_int,(unsigned_char)2>>(this,instr_00,&local_28,out_trap);
  if (RVar2 == Ok) {
    for (local_51 = 0; local_51 < 2; local_51 = local_51 + 1) {
      puVar3 = Simd<unsigned_int,_(unsigned_char)'\x02'>::operator[](&local_28,local_51);
      uVar1 = *puVar3;
      puVar4 = Simd<unsigned_long,_(unsigned_char)'\x02'>::operator[]
                         ((Simd<unsigned_long,_(unsigned_char)__x02_> *)auStack_50,local_51);
      *puVar4 = (ulong)uVar1;
    }
    value.v[1] = result.v[0];
    value.v[0] = _auStack_50;
    Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,value);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = Trap;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[i];
  }
  Push(result);
  return RunResult::Ok;
}